

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidShapes.cpp
# Opt level: O3

void __thiscall iDynTree::Box::~Box(Box *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_SolidShape)._vptr_SolidShape = (_func_int **)&PTR___cxa_pure_virtual_00185618;
  pcVar1 = (this->super_SolidShape).m_material.m_name._M_dataplus._M_p;
  paVar2 = &(this->super_SolidShape).m_material.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->super_SolidShape).m_material.m_texture._M_dataplus._M_p;
  paVar2 = &(this->super_SolidShape).m_material.m_texture.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->super_SolidShape).name._M_dataplus._M_p;
  paVar2 = &(this->super_SolidShape).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

SolidShape::~SolidShape()
    {
    }